

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy.c
# Opt level: O2

upb_Array *
upb_Array_DeepClone(upb_Array *array,upb_CType value_type,upb_MiniTable *sub,upb_Arena *arena)

{
  byte bVar1;
  size_t sVar2;
  uint __line;
  _Bool _Var3;
  upb_Array *arr;
  ulong uVar4;
  size_t i;
  size_t i_00;
  char *__assertion;
  upb_MessageValue val;
  ulong local_40;
  upb_MiniTable *local_38;
  
  sVar2 = array->size_dont_copy_me__upb_internal_use_only;
  local_40 = (ulong)(value_type - kUpb_CType_Bool);
  bVar1 = _upb_CType_SizeLg2_dont_copy_me__upb_internal_use_only_size[local_40];
  local_38 = sub;
  arr = (upb_Array *)upb_Arena_Malloc(arena,(sVar2 << (bVar1 & 0x3f)) + 0x18);
  if (arr == (upb_Array *)0x0) {
    return (upb_Array *)0x0;
  }
  uVar4 = ((ulong)(uint)(int)(char)bVar1 - 1) + (ulong)((int)local_40 == 0) | (ulong)(arr + 1);
  arr->data_dont_copy_me__upb_internal_use_only = uVar4;
  arr->size_dont_copy_me__upb_internal_use_only = 0;
  arr->capacity_dont_copy_me__upb_internal_use_only = sVar2;
  if ((uVar4 & 4) == 0) {
    if (arena != (upb_Arena *)0x0 || sVar2 == 0) {
      arr->size_dont_copy_me__upb_internal_use_only = sVar2;
      i_00 = 0;
      while( true ) {
        if (sVar2 == i_00) {
          return arr;
        }
        val = upb_Array_Get(array,i_00);
        _Var3 = upb_Clone_MessageValue(&val,value_type,local_38,arena);
        if (!_Var3) break;
        upb_Array_Set(arr,i_00,val);
        i_00 = i_00 + 1;
      }
      return (upb_Array *)0x0;
    }
    __assertion = "size <= array->size_dont_copy_me__upb_internal_use_only || arena";
    __line = 0x6e;
  }
  else {
    __assertion = "!upb_Array_IsFrozen(array)";
    __line = 0x6c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/array.h"
                ,__line,
                "_Bool _upb_Array_ResizeUninitialized_dont_copy_me__upb_internal_use_only(struct upb_Array *, size_t, upb_Arena *)"
               );
}

Assistant:

upb_Array* upb_Array_DeepClone(const upb_Array* array, upb_CType value_type,
                               const upb_MiniTable* sub, upb_Arena* arena) {
  const size_t size = upb_Array_Size(array);
  const int lg2 = UPB_PRIVATE(_upb_CType_SizeLg2)(value_type);
  upb_Array* cloned_array = UPB_PRIVATE(_upb_Array_New)(arena, size, lg2);
  if (!cloned_array) {
    return NULL;
  }
  if (!UPB_PRIVATE(_upb_Array_ResizeUninitialized)(cloned_array, size, arena)) {
    return NULL;
  }
  for (size_t i = 0; i < size; ++i) {
    upb_MessageValue val = upb_Array_Get(array, i);
    if (!upb_Clone_MessageValue(&val, value_type, sub, arena)) {
      return NULL;
    }
    upb_Array_Set(cloned_array, i, val);
  }
  return cloned_array;
}